

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test::TestBody
          (ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_410;
  Message local_408;
  Script local_400;
  string local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_2;
  Message local_390;
  int64_t local_388;
  int64_t local_380;
  undefined1 local_378;
  ConfidentialValue local_370;
  Amount local_348;
  int64_t local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_1;
  Message local_318;
  string local_310;
  ConfidentialAssetId local_2f0;
  string local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar;
  Message local_290 [2];
  ConfidentialTxOut local_280;
  int64_t local_188;
  undefined1 local_180;
  undefined1 local_178 [8];
  Amount amount;
  allocator local_151;
  string local_150;
  undefined1 local_130 [8];
  ConfidentialAssetId asset;
  ConfidentialTxOut txout;
  ConfidentialTxOut_CreateDestroyAmountTxOutTest_Test *this_local;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut((ConfidentialTxOut *)&asset.version_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,"1234567890123456789012345678901234567890123456789012345678901234"
             ,&local_151);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(980000000);
  local_188 = AVar3.amount_;
  local_180 = AVar3.ignore_check_;
  local_178 = (undefined1  [8])local_188;
  amount.amount_._0_1_ = local_180;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxOut::CreateDestroyAmountTxOut
                (&local_280,(ConfidentialAssetId *)local_130,(Amount *)local_178);
      cfd::core::ConfidentialTxOut::operator=((ConfidentialTxOut *)&asset.version_,&local_280);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_280);
    }
  }
  else {
    testing::Message::Message(local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x125,
               "Expected: (txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_290);
  }
  cfd::core::ConfidentialTxOut::GetAsset(&local_2f0,(ConfidentialTxOut *)&asset.version_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2c8,&local_2f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_310,(ConfidentialAssetId *)local_130);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetAsset().GetHex().c_str()","asset.GetHex().c_str()",
             pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2c8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  cfd::core::ConfidentialTxOut::GetConfidentialValue
            (&local_370,(ConfidentialTxOut *)&asset.version_);
  AVar3 = cfd::core::ConfidentialValue::GetAmount(&local_370);
  local_380 = AVar3.amount_;
  local_378 = AVar3.ignore_check_;
  local_348.amount_ = local_380;
  local_348.ignore_check_ = (bool)local_378;
  local_338 = cfd::core::Amount::GetSatoshiValue(&local_348);
  local_388 = cfd::core::Amount::GetSatoshiValue((Amount *)local_178);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_330,
             "txout.GetConfidentialValue().GetAmount().GetSatoshiValue()","amount.GetSatoshiValue()"
             ,&local_338,&local_388);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  cfd::core::AbstractTxOut::GetLockingScript(&local_400,(AbstractTxOut *)&asset.version_);
  cfd::core::Script::ToString_abi_cxx11_(&local_3c8,&local_400);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3a8,"txout.GetLockingScript().ToString().c_str()","\"OP_RETURN\"",
             pcVar2,"OP_RETURN");
  std::__cxx11::string::~string((string *)&local_3c8);
  cfd::core::Script::~Script(&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_130);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&asset.version_);
  return;
}

Assistant:

TEST(ConfidentialTxOut, CreateDestroyAmountTxOutTest) {  
  ConfidentialTxOut txout;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  Amount amount = Amount::CreateBySatoshiAmount(980000000);
  EXPECT_NO_THROW((txout = ConfidentialTxOut::CreateDestroyAmountTxOut(asset, amount)));
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
            amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().ToString().c_str(), "OP_RETURN");
}